

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

bool __thiscall qpdf::Array::setAt(Array *this,int at,QPDFObjectHandle *oh)

{
  bool bVar1;
  int iVar2;
  QPDF_Array *this_00;
  pointer pSVar3;
  mapped_type *this_01;
  reference this_02;
  QPDF_Array *a;
  QPDFObjectHandle *oh_local;
  Array *pAStack_18;
  int at_local;
  Array *this_local;
  
  if ((-1 < at) && (oh_local._4_4_ = at, pAStack_18 = this, iVar2 = size(this), at < iVar2)) {
    this_00 = array(this);
    checkOwnership(this,oh);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this_00);
    if (bVar1) {
      pSVar3 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
               operator->(&this_00->sp);
      this_01 = std::
                map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                ::operator[](&pSVar3->elements,(key_type *)((long)&oh_local + 4));
      QPDFObjectHandle::operator=(this_01,oh);
    }
    else {
      this_02 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator[]
                          (&this_00->elements,(long)oh_local._4_4_);
      QPDFObjectHandle::operator=(this_02,oh);
    }
    return true;
  }
  return false;
}

Assistant:

bool
Array::setAt(int at, QPDFObjectHandle const& oh)
{
    if (at < 0 || at >= size()) {
        return false;
    }
    auto a = array();
    checkOwnership(oh);
    if (a->sp) {
        a->sp->elements[at] = oh;
    } else {
        a->elements[size_t(at)] = oh;
    }
    return true;
}